

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void TableSettingsHandler_ApplyAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  int iVar1;
  ImGuiTable *pIVar2;
  long in_RDI;
  ImGuiTable *table;
  int i;
  ImGuiContext *g;
  ImPoolIdx in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    iVar3 = local_1c;
    iVar1 = ImPool<ImGuiTable>::GetSize((ImPool<ImGuiTable> *)(in_RDI + 0x1ed0));
    if (iVar3 == iVar1) break;
    pIVar2 = ImPool<ImGuiTable>::GetByIndex
                       ((ImPool<ImGuiTable> *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
    pIVar2->IsSettingsRequestLoad = true;
    pIVar2->SettingsOffset = -1;
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

static void TableSettingsHandler_ApplyAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetSize(); i++)
    {
        ImGuiTable* table = g.Tables.GetByIndex(i);
        table->IsSettingsRequestLoad = true;
        table->SettingsOffset = -1;
    }
}